

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_setup.h
# Opt level: O3

void SetupStyleFromHue(void)

{
  float *out_g;
  float *out_b;
  ImGuiStyle *pIVar1;
  float b;
  float g;
  float r;
  float dummy;
  ImVec4 rgb;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48 [6];
  
  ImGui::Begin("Hue Style",(bool *)0x0,0);
  ImGui::SliderInt("master hue",&SetupStyleFromHue::hue,0,0xff,"%.0f");
  out_g = local_48 + 1;
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  local_48[2] = 0.0;
  local_48[3] = 0.0;
  ImGui::ColorEditMode(1);
  out_b = local_48 + 2;
  ImGui::ColorConvertHSVtoRGB
            ((float)SetupStyleFromHue::hue / 255.0,SetupStyleFromHue::col_main_sat,
             SetupStyleFromHue::col_main_val,local_48,out_g,out_b);
  ImGui::ColorEdit3("main",local_48);
  ImGui::ColorConvertRGBtoHSV
            (local_48[0],local_48[1],local_48[2],&local_4c,&SetupStyleFromHue::col_main_sat,
             &SetupStyleFromHue::col_main_val);
  ImGui::ColorConvertHSVtoRGB
            ((float)SetupStyleFromHue::hue / 255.0,SetupStyleFromHue::col_area_sat,
             SetupStyleFromHue::col_area_val,local_48,out_g,out_b);
  ImGui::ColorEdit3("area",local_48);
  ImGui::ColorConvertRGBtoHSV
            (local_48[0],local_48[1],local_48[2],&local_4c,&SetupStyleFromHue::col_area_sat,
             &SetupStyleFromHue::col_area_val);
  ImGui::ColorConvertHSVtoRGB
            ((float)SetupStyleFromHue::hue / 255.0,SetupStyleFromHue::col_back_sat,
             SetupStyleFromHue::col_back_val,local_48,out_g,out_b);
  ImGui::ColorEdit3("back",local_48);
  ImGui::ColorConvertRGBtoHSV
            (local_48[0],local_48[1],local_48[2],&local_4c,&SetupStyleFromHue::col_back_sat,
             &SetupStyleFromHue::col_back_val);
  ImGui::End();
  pIVar1 = ImGui::GetStyle();
  ImGui::ColorConvertHSVtoRGB
            ((float)SetupStyleFromHue::hue / 255.0,0.078431375,0.92156863,&local_74,&local_78,
             &local_7c);
  local_5c = local_74;
  local_60 = local_78;
  local_64 = local_7c;
  ImGui::ColorConvertHSVtoRGB
            ((float)SetupStyleFromHue::hue / 255.0,SetupStyleFromHue::col_main_sat,
             SetupStyleFromHue::col_main_val,&local_74,&local_78,&local_7c);
  local_50 = local_74;
  local_54 = local_78;
  local_58 = local_7c;
  ImGui::ColorConvertHSVtoRGB
            ((float)SetupStyleFromHue::hue / 255.0,SetupStyleFromHue::col_back_sat,
             SetupStyleFromHue::col_back_val,&local_74,&local_78,&local_7c);
  local_68 = local_74;
  local_6c = local_78;
  local_70 = local_7c;
  ImGui::ColorConvertHSVtoRGB
            ((float)SetupStyleFromHue::hue / 255.0,SetupStyleFromHue::col_area_sat,
             SetupStyleFromHue::col_area_val,&local_74,&local_78,&local_7c);
  pIVar1->Colors[0].x = local_5c;
  pIVar1->Colors[0].y = local_60;
  pIVar1->Colors[0].z = local_64;
  pIVar1->Colors[0].w = 1.0;
  pIVar1->Colors[1].x = local_5c;
  pIVar1->Colors[1].y = local_60;
  pIVar1->Colors[1].z = local_64;
  pIVar1->Colors[1].w = 0.58;
  pIVar1->Colors[2].x = local_68;
  pIVar1->Colors[2].y = local_6c;
  pIVar1->Colors[2].z = local_70;
  pIVar1->Colors[2].w = 1.0;
  pIVar1->Colors[3].x = local_74;
  pIVar1->Colors[3].y = local_78;
  pIVar1->Colors[3].z = local_7c;
  pIVar1->Colors[3].w = 0.0;
  pIVar1->Colors[5].x = local_5c;
  pIVar1->Colors[5].y = local_60;
  pIVar1->Colors[5].z = local_64;
  pIVar1->Colors[5].w = 0.3;
  pIVar1->Colors[6].x = 0.0;
  pIVar1->Colors[6].y = 0.0;
  pIVar1->Colors[6].z = 0.0;
  pIVar1->Colors[6].w = 0.0;
  pIVar1->Colors[7].x = local_74;
  pIVar1->Colors[7].y = local_78;
  pIVar1->Colors[7].z = local_7c;
  pIVar1->Colors[7].w = 1.0;
  pIVar1->Colors[8].x = local_50;
  pIVar1->Colors[8].y = local_54;
  pIVar1->Colors[8].z = local_58;
  pIVar1->Colors[8].w = 0.68;
  pIVar1->Colors[9].x = local_50;
  pIVar1->Colors[9].y = local_54;
  pIVar1->Colors[9].z = local_58;
  pIVar1->Colors[9].w = 1.0;
  pIVar1->Colors[10].x = local_50;
  pIVar1->Colors[10].y = local_54;
  pIVar1->Colors[10].z = local_58;
  pIVar1->Colors[10].w = 0.45;
  pIVar1->Colors[0xb].x = local_50;
  pIVar1->Colors[0xb].y = local_54;
  pIVar1->Colors[0xb].z = local_58;
  pIVar1->Colors[0xb].w = 0.35;
  pIVar1->Colors[0xc].x = local_50;
  pIVar1->Colors[0xc].y = local_54;
  pIVar1->Colors[0xc].z = local_58;
  pIVar1->Colors[0xc].w = 0.78;
  pIVar1->Colors[0xd].x = local_74;
  pIVar1->Colors[0xd].y = local_78;
  pIVar1->Colors[0xd].z = local_7c;
  pIVar1->Colors[0xd].w = 0.57;
  pIVar1->Colors[0xe].x = local_74;
  pIVar1->Colors[0xe].y = local_78;
  pIVar1->Colors[0xe].z = local_7c;
  pIVar1->Colors[0xe].w = 1.0;
  pIVar1->Colors[0xf].x = local_50;
  pIVar1->Colors[0xf].y = local_54;
  pIVar1->Colors[0xf].z = local_58;
  pIVar1->Colors[0xf].w = 0.31;
  pIVar1->Colors[0x10].x = local_50;
  pIVar1->Colors[0x10].y = local_54;
  pIVar1->Colors[0x10].z = local_58;
  pIVar1->Colors[0x10].w = 0.78;
  pIVar1->Colors[0x11].x = local_50;
  pIVar1->Colors[0x11].y = local_54;
  pIVar1->Colors[0x11].z = local_58;
  pIVar1->Colors[0x11].w = 1.0;
  pIVar1->Colors[0x12].x = local_74;
  pIVar1->Colors[0x12].y = local_78;
  pIVar1->Colors[0x12].z = local_7c;
  pIVar1->Colors[0x12].w = 1.0;
  pIVar1->Colors[0x13].x = local_50;
  pIVar1->Colors[0x13].y = local_54;
  pIVar1->Colors[0x13].z = local_58;
  pIVar1->Colors[0x13].w = 0.8;
  pIVar1->Colors[0x14].x = local_50;
  pIVar1->Colors[0x14].y = local_54;
  pIVar1->Colors[0x14].z = local_58;
  pIVar1->Colors[0x14].w = 0.24;
  pIVar1->Colors[0x15].x = local_50;
  pIVar1->Colors[0x15].y = local_54;
  pIVar1->Colors[0x15].z = local_58;
  pIVar1->Colors[0x15].w = 1.0;
  pIVar1->Colors[0x16].x = local_50;
  pIVar1->Colors[0x16].y = local_54;
  pIVar1->Colors[0x16].z = local_58;
  pIVar1->Colors[0x16].w = 0.44;
  pIVar1->Colors[0x17].x = local_50;
  pIVar1->Colors[0x17].y = local_54;
  pIVar1->Colors[0x17].z = local_58;
  pIVar1->Colors[0x17].w = 0.86;
  pIVar1->Colors[0x18].x = local_50;
  pIVar1->Colors[0x18].y = local_54;
  pIVar1->Colors[0x18].z = local_58;
  pIVar1->Colors[0x18].w = 1.0;
  pIVar1->Colors[0x19].x = local_50;
  pIVar1->Colors[0x19].y = local_54;
  pIVar1->Colors[0x19].z = local_58;
  pIVar1->Colors[0x19].w = 0.76;
  pIVar1->Colors[0x1a].x = local_50;
  pIVar1->Colors[0x1a].y = local_54;
  pIVar1->Colors[0x1a].z = local_58;
  pIVar1->Colors[0x1a].w = 0.86;
  pIVar1->Colors[0x1b].x = local_50;
  pIVar1->Colors[0x1b].y = local_54;
  pIVar1->Colors[0x1b].z = local_58;
  pIVar1->Colors[0x1b].w = 1.0;
  pIVar1->Colors[0x1c].x = local_5c;
  pIVar1->Colors[0x1c].y = local_60;
  pIVar1->Colors[0x1c].z = local_64;
  pIVar1->Colors[0x1c].w = 0.32;
  pIVar1->Colors[0x1d].x = local_5c;
  pIVar1->Colors[0x1d].y = local_60;
  pIVar1->Colors[0x1d].z = local_64;
  pIVar1->Colors[0x1d].w = 0.78;
  pIVar1->Colors[0x1e].x = local_5c;
  pIVar1->Colors[0x1e].y = local_60;
  pIVar1->Colors[0x1e].z = local_64;
  pIVar1->Colors[0x1e].w = 1.0;
  pIVar1->Colors[0x1f].x = local_50;
  pIVar1->Colors[0x1f].y = local_54;
  pIVar1->Colors[0x1f].z = local_58;
  pIVar1->Colors[0x1f].w = 0.2;
  pIVar1->Colors[0x20].x = local_50;
  pIVar1->Colors[0x20].y = local_54;
  pIVar1->Colors[0x20].z = local_58;
  pIVar1->Colors[0x20].w = 0.78;
  pIVar1->Colors[0x21].x = local_50;
  pIVar1->Colors[0x21].y = local_54;
  pIVar1->Colors[0x21].z = local_58;
  pIVar1->Colors[0x21].w = 1.0;
  pIVar1->Colors[0x22].x = local_5c;
  pIVar1->Colors[0x22].y = local_60;
  pIVar1->Colors[0x22].z = local_64;
  pIVar1->Colors[0x22].w = 0.16;
  pIVar1->Colors[0x23].x = local_5c;
  pIVar1->Colors[0x23].y = local_60;
  pIVar1->Colors[0x23].z = local_64;
  pIVar1->Colors[0x23].w = 0.39;
  pIVar1->Colors[0x24].x = local_5c;
  pIVar1->Colors[0x24].y = local_60;
  pIVar1->Colors[0x24].z = local_64;
  pIVar1->Colors[0x24].w = 1.0;
  pIVar1->Colors[0x25].x = local_5c;
  pIVar1->Colors[0x25].y = local_60;
  pIVar1->Colors[0x25].z = local_64;
  pIVar1->Colors[0x25].w = 0.63;
  pIVar1->Colors[0x26].x = local_50;
  pIVar1->Colors[0x26].y = local_54;
  pIVar1->Colors[0x26].z = local_58;
  pIVar1->Colors[0x26].w = 1.0;
  pIVar1->Colors[0x27].x = local_5c;
  pIVar1->Colors[0x27].y = local_60;
  pIVar1->Colors[0x27].z = local_64;
  pIVar1->Colors[0x27].w = 0.63;
  pIVar1->Colors[0x28].x = local_50;
  pIVar1->Colors[0x28].y = local_54;
  pIVar1->Colors[0x28].z = local_58;
  pIVar1->Colors[0x28].w = 1.0;
  pIVar1->Colors[0x29].x = local_50;
  pIVar1->Colors[0x29].y = local_54;
  pIVar1->Colors[0x29].z = local_58;
  *(undefined8 *)&pIVar1->Colors[0x29].w = 0x3e4ccccd3edc28f6;
  pIVar1->Colors[0x2a].y = 0.2;
  pIVar1->Colors[0x2a].z = 0.2;
  pIVar1->Colors[0x2a].w = 0.35;
  return;
}

Assistant:

void SetupStyleFromHue()
{
#if 1
    // FIXME: those should become parameters to the function
    static int hue = 140;
    static float col_main_sat = 180.f/255.f;
    static float col_main_val = 161.f/255.f;
    static float col_area_sat = 124.f/255.f;
    static float col_area_val = 100.f/255.f;
    static float col_back_sat = 59.f/255.f;
    static float col_back_val = 40.f/255.f;

    ImGui::Begin("Hue Style");
    ImGui::SliderInt("master hue", &hue, 0, 255);

    float dummy;
    ImVec4 rgb;
    ImGui::ColorEditMode(ImGuiColorEditMode_HSV);

    ImGui::ColorConvertHSVtoRGB(hue/255.f, col_main_sat, col_main_val, rgb.x, rgb.y, rgb.z);
    ImGui::ColorEdit3("main", &rgb.x);
    ImGui::ColorConvertRGBtoHSV(rgb.x, rgb.y, rgb.z, dummy, col_main_sat, col_main_val);

    ImGui::ColorConvertHSVtoRGB(hue/255.f, col_area_sat, col_area_val, rgb.x, rgb.y, rgb.z);
    ImGui::ColorEdit3("area", &rgb.x);
    ImGui::ColorConvertRGBtoHSV(rgb.x, rgb.y, rgb.z, dummy, col_area_sat, col_area_val);

    ImGui::ColorConvertHSVtoRGB(hue/255.f, col_back_sat, col_back_val, rgb.x, rgb.y, rgb.z);
    ImGui::ColorEdit3("back", &rgb.x);
    ImGui::ColorConvertRGBtoHSV(rgb.x, rgb.y, rgb.z, dummy, col_back_sat, col_back_val);

    ImGui::End();
#endif

    ImGuiStyle& style = ImGui::GetStyle();

    ImVec4 col_text = ImColor::HSV(hue/255.f,  20.f/255.f, 235.f/255.f);
    ImVec4 col_main = ImColor::HSV(hue/255.f, col_main_sat, col_main_val);
    ImVec4 col_back = ImColor::HSV(hue/255.f, col_back_sat, col_back_val);
    ImVec4 col_area = ImColor::HSV(hue/255.f, col_area_sat, col_area_val);

    style.Colors[ImGuiCol_Text]                  = ImVec4(col_text.x, col_text.y, col_text.z, 1.00f);
    style.Colors[ImGuiCol_TextDisabled]          = ImVec4(col_text.x, col_text.y, col_text.z, 0.58f);
    style.Colors[ImGuiCol_WindowBg]              = ImVec4(col_back.x, col_back.y, col_back.z, 1.00f);
    style.Colors[ImGuiCol_ChildWindowBg]         = ImVec4(col_area.x, col_area.y, col_area.z, 0.00f);
    style.Colors[ImGuiCol_Border]                = ImVec4(col_text.x, col_text.y, col_text.z, 0.30f);
    style.Colors[ImGuiCol_BorderShadow]          = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
    style.Colors[ImGuiCol_FrameBg]               = ImVec4(col_area.x, col_area.y, col_area.z, 1.00f);
    style.Colors[ImGuiCol_FrameBgHovered]        = ImVec4(col_main.x, col_main.y, col_main.z, 0.68f);
    style.Colors[ImGuiCol_FrameBgActive]         = ImVec4(col_main.x, col_main.y, col_main.z, 1.00f);
    style.Colors[ImGuiCol_TitleBg]               = ImVec4(col_main.x, col_main.y, col_main.z, 0.45f);
    style.Colors[ImGuiCol_TitleBgCollapsed]      = ImVec4(col_main.x, col_main.y, col_main.z, 0.35f);
    style.Colors[ImGuiCol_TitleBgActive]         = ImVec4(col_main.x, col_main.y, col_main.z, 0.78f);
    style.Colors[ImGuiCol_MenuBarBg]             = ImVec4(col_area.x, col_area.y, col_area.z, 0.57f);
    style.Colors[ImGuiCol_ScrollbarBg]           = ImVec4(col_area.x, col_area.y, col_area.z, 1.00f);
    style.Colors[ImGuiCol_ScrollbarGrab]         = ImVec4(col_main.x, col_main.y, col_main.z, 0.31f);
    style.Colors[ImGuiCol_ScrollbarGrabHovered]  = ImVec4(col_main.x, col_main.y, col_main.z, 0.78f);
    style.Colors[ImGuiCol_ScrollbarGrabActive]   = ImVec4(col_main.x, col_main.y, col_main.z, 1.00f);
    style.Colors[ImGuiCol_ComboBg]               = ImVec4(col_area.x, col_area.y, col_area.z, 1.00f);
    style.Colors[ImGuiCol_CheckMark]             = ImVec4(col_main.x, col_main.y, col_main.z, 0.80f);
    style.Colors[ImGuiCol_SliderGrab]            = ImVec4(col_main.x, col_main.y, col_main.z, 0.24f);
    style.Colors[ImGuiCol_SliderGrabActive]      = ImVec4(col_main.x, col_main.y, col_main.z, 1.00f);
    style.Colors[ImGuiCol_Button]                = ImVec4(col_main.x, col_main.y, col_main.z, 0.44f);
    style.Colors[ImGuiCol_ButtonHovered]         = ImVec4(col_main.x, col_main.y, col_main.z, 0.86f);
    style.Colors[ImGuiCol_ButtonActive]          = ImVec4(col_main.x, col_main.y, col_main.z, 1.00f);
    style.Colors[ImGuiCol_Header]                = ImVec4(col_main.x, col_main.y, col_main.z, 0.76f);
    style.Colors[ImGuiCol_HeaderHovered]         = ImVec4(col_main.x, col_main.y, col_main.z, 0.86f);
    style.Colors[ImGuiCol_HeaderActive]          = ImVec4(col_main.x, col_main.y, col_main.z, 1.00f);
    style.Colors[ImGuiCol_Column]                = ImVec4(col_text.x, col_text.y, col_text.z, 0.32f);
    style.Colors[ImGuiCol_ColumnHovered]         = ImVec4(col_text.x, col_text.y, col_text.z, 0.78f);
    style.Colors[ImGuiCol_ColumnActive]          = ImVec4(col_text.x, col_text.y, col_text.z, 1.00f);
    style.Colors[ImGuiCol_ResizeGrip]            = ImVec4(col_main.x, col_main.y, col_main.z, 0.20f);
    style.Colors[ImGuiCol_ResizeGripHovered]     = ImVec4(col_main.x, col_main.y, col_main.z, 0.78f);
    style.Colors[ImGuiCol_ResizeGripActive]      = ImVec4(col_main.x, col_main.y, col_main.z, 1.00f);
    style.Colors[ImGuiCol_CloseButton]           = ImVec4(col_text.x, col_text.y, col_text.z, 0.16f);
    style.Colors[ImGuiCol_CloseButtonHovered]    = ImVec4(col_text.x, col_text.y, col_text.z, 0.39f);
    style.Colors[ImGuiCol_CloseButtonActive]     = ImVec4(col_text.x, col_text.y, col_text.z, 1.00f);
    style.Colors[ImGuiCol_PlotLines]             = ImVec4(col_text.x, col_text.y, col_text.z, 0.63f);
    style.Colors[ImGuiCol_PlotLinesHovered]      = ImVec4(col_main.x, col_main.y, col_main.z, 1.00f);
    style.Colors[ImGuiCol_PlotHistogram]         = ImVec4(col_text.x, col_text.y, col_text.z, 0.63f);
    style.Colors[ImGuiCol_PlotHistogramHovered]  = ImVec4(col_main.x, col_main.y, col_main.z, 1.00f);
    style.Colors[ImGuiCol_TextSelectedBg]        = ImVec4(col_main.x, col_main.y, col_main.z, 0.43f);
    //style.Colors[ImGuiCol_TooltipBg]             = ImVec4(col_main.x, col_main.y, col_main.z, 0.92f);
    style.Colors[ImGuiCol_ModalWindowDarkening]  = ImVec4(0.20f, 0.20f, 0.20f, 0.35f);
}